

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

optional<tinyusdz::value::StringData> * __thiscall
tinyusdz::MetaVariable::get_value<tinyusdz::value::StringData>
          (optional<tinyusdz::value::StringData> *__return_storage_ptr__,MetaVariable *this)

{
  pointer pcVar1;
  StringData *pSVar2;
  
  pSVar2 = tinyusdz::value::Value::as<tinyusdz::value::StringData>(&this->_value,false);
  if (pSVar2 == (StringData *)0x0) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
  }
  else {
    __return_storage_ptr__->has_value_ = true;
    *(undefined1 **)&__return_storage_ptr__->contained =
         (undefined1 *)((long)&__return_storage_ptr__->contained + 0x10);
    pcVar1 = (pSVar2->value)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->contained,pcVar1,
               pcVar1 + (pSVar2->value)._M_string_length);
    *(int *)((long)&__return_storage_ptr__->contained + 0x28) = pSVar2->line_col;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) =
         *(undefined8 *)&pSVar2->is_triple_quoted;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    if (const T *v = _value.as<T>()) {
      return *v;
    }

    return nonstd::nullopt;
  }